

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::updateTransitionMatrices
          (BeagleCPUImpl<float,_1,_0> *this,int eigenIndex,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,int count)

{
  (*this->gEigenDecomposition->_vptr_EigenDecomposition[3])();
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::updateTransitionMatrices(int eigenIndex,
                                            const int* probabilityIndices,
                                            const int* firstDerivativeIndices,
                                            const int* secondDerivativeIndices,
                                            const double* edgeLengths,
                                            int count) {
    // for (int i = 0; i < count; i++) {
    //     printf("uTM %d %d %f %d\n", eigenIndex, probabilityIndices[i], edgeLengths[i], 0);
    // }

    gEigenDecomposition->updateTransitionMatrices(eigenIndex,probabilityIndices,firstDerivativeIndices,secondDerivativeIndices,
                                                  edgeLengths,gCategoryRates[0],gTransitionMatrices,count);
    return BEAGLE_SUCCESS;
}